

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Parser::matchToken(Parser *this,TokenType type,bool optional)

{
  Token *pTVar1;
  undefined3 in_register_00000011;
  bool bVar2;
  
  if (CONCAT31(in_register_00000011,optional) == 0) {
    pTVar1 = nextToken(this);
    bVar2 = pTVar1->type == type;
  }
  else {
    pTVar1 = peekToken(this,0);
    bVar2 = true;
    if (pTVar1->type == type) {
      eatToken(this);
    }
  }
  return bVar2;
}

Assistant:

bool Parser::matchToken(TokenType type, bool optional)
{
	if (optional)
	{
		const Token& token = peekToken();
		if (token.type == type)
			eatToken();
		return true;
	}
	
	return nextToken().type == type;
}